

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aws.c
# Opt level: O0

void nn_aws_start(nn_aws *self,nn_usock *listener)

{
  nn_usock *listener_local;
  nn_aws *self_local;
  
  if (self->state != 1) {
    fprintf(_stderr,"Assertion failed: %d == %s (%s:%d)\n",(ulong)(uint)self->state,
            "NN_AWS_STATE_IDLE",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/aws.c"
            ,0x57);
    fflush(_stderr);
    nn_err_abort();
  }
  self->listener = listener;
  (self->listener_owner).src = 3;
  (self->listener_owner).fsm = &self->fsm;
  nn_usock_swap_owner(listener,&self->listener_owner);
  nn_fsm_start(&self->fsm);
  return;
}

Assistant:

void nn_aws_start (struct nn_aws *self, struct nn_usock *listener)
{
    nn_assert_state (self, NN_AWS_STATE_IDLE);

    /*  Take ownership of the listener socket. */
    self->listener = listener;
    self->listener_owner.src = NN_AWS_SRC_LISTENER;
    self->listener_owner.fsm = &self->fsm;
    nn_usock_swap_owner (listener, &self->listener_owner);

    /*  Start the state machine. */
    nn_fsm_start (&self->fsm);
}